

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O1

void __thiscall
supermap::BST<supermap::Key<3ul>,unsigned_long,unsigned_long>::createLikeThis
          (BST<supermap::Key<3ul>,unsigned_long,unsigned_long> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  *puVar1 = &PTR_add_00207468;
  puVar1[1] = &DAT_002074b8;
  *(undefined4 *)(puVar1 + 3) = 0;
  puVar1[4] = 0;
  puVar1[5] = puVar1 + 3;
  puVar1[6] = puVar1 + 3;
  puVar1[7] = 0;
  *(undefined8 **)this = puVar1;
  return;
}

Assistant:

std::unique_ptr<ExtractibleKeyValueStorage<Key, Value, IndexT>> createLikeThis() const override {
        return std::make_unique<BST<Key, Value, IndexT>>();
    }